

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall DIntermissionController::Destroy(DIntermissionController *this)

{
  FIntermissionDescriptor *this_00;
  bool bVar1;
  DIntermissionScreen *pDVar2;
  DIntermissionController *this_local;
  
  DObject::Destroy(&this->super_DObject);
  bVar1 = TObjPtr<DIntermissionScreen>::operator!=(&this->mScreen,(DIntermissionScreen *)0x0);
  if (bVar1) {
    pDVar2 = TObjPtr<DIntermissionScreen>::operator->(&this->mScreen);
    (*(pDVar2->super_DObject)._vptr_DObject[4])();
  }
  if (((this->mDeleteDesc & 1U) != 0) &&
     (this_00 = this->mDesc, this_00 != (FIntermissionDescriptor *)0x0)) {
    FIntermissionDescriptor::~FIntermissionDescriptor(this_00);
    operator_delete(this_00,0x18);
  }
  this->mDesc = (FIntermissionDescriptor *)0x0;
  if (CurrentIntermission == this) {
    CurrentIntermission = (DIntermissionController *)0x0;
  }
  return;
}

Assistant:

void DIntermissionController::Destroy ()
{
	Super::Destroy();
	if (mScreen != NULL) mScreen->Destroy();
	if (mDeleteDesc) delete mDesc;
	mDesc = NULL;
	if (CurrentIntermission == this) CurrentIntermission = NULL;
}